

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTriangleMeshShape.cpp
# Opt level: O0

void __thiscall
btTriangleMeshShape::btTriangleMeshShape
          (btTriangleMeshShape *this,btStridingMeshInterface *meshInterface)

{
  byte bVar1;
  long *in_RSI;
  undefined8 *in_RDI;
  btTriangleMeshShape *in_stack_00000020;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  
  btConcaveShape::btConcaveShape
            ((btConcaveShape *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
  *in_RDI = &PTR__btTriangleMeshShape_002e5e08;
  btVector3::btVector3((btVector3 *)(in_RDI + 4));
  btVector3::btVector3((btVector3 *)(in_RDI + 6));
  in_RDI[8] = in_RSI;
  *(undefined4 *)(in_RDI + 1) = 0x15;
  bVar1 = (**(code **)(*in_RSI + 0x50))();
  if ((bVar1 & 1) == 0) {
    recalcLocalAabb(in_stack_00000020);
  }
  else {
    (**(code **)(*in_RSI + 0x60))(in_RSI,in_RDI + 4,in_RDI + 6);
  }
  return;
}

Assistant:

btTriangleMeshShape::btTriangleMeshShape(btStridingMeshInterface* meshInterface)
: btConcaveShape (), m_meshInterface(meshInterface)
{
	m_shapeType = TRIANGLE_MESH_SHAPE_PROXYTYPE;
	if(meshInterface->hasPremadeAabb())
	{
		meshInterface->getPremadeAabb(&m_localAabbMin, &m_localAabbMax);
	}
	else
	{
		recalcLocalAabb();
	}
}